

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void Am_Connection::Wait_For_Connect(void)

{
  fd_set *__arr;
  uint __i;
  int nfds;
  fd_set read_fd;
  timeval select_timeout;
  
  read_fd.fds_bits[0xf] = 1;
  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
    (&__i + (ulong)(uint)__arr * 2)[0] = 0;
    (&__i + (ulong)(uint)__arr * 2)[1] = 0;
  }
  *(ulong *)(&__i + (long)(m_parent_socket / 0x40) * 2) =
       1L << ((byte)((long)m_parent_socket % 0x40) & 0x3f) |
       *(ulong *)(&__i + (long)(m_parent_socket / 0x40) * 2);
  select(m_parent_socket + 1,(fd_set *)&__i,(fd_set *)0x0,(fd_set *)0x0,
         (timeval *)(read_fd.fds_bits + 0xf));
  if ((*(ulong *)(&__i + (long)(m_parent_socket / 0x40) * 2) &
      1L << ((byte)((long)m_parent_socket % 0x40) & 0x3f)) != 0) {
    Handle_Sockets((fd_set *)&__i);
  }
  return;
}

Assistant:

void
Am_Connection::Wait_For_Connect(void)
{
  struct timeval select_timeout;
  select_timeout.tv_sec = 1;
  select_timeout.tv_usec = 0;

  fd_set read_fd;
  int nfds;
  FD_ZERO(&read_fd);
  FD_SET(m_parent_socket, &read_fd);

  nfds = m_parent_socket + 1;

  (void)select(nfds, &read_fd, nullptr, nullptr, &select_timeout);

  if (FD_ISSET(m_parent_socket, &read_fd))
    Am_Connection::Handle_Sockets(&read_fd);
}